

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O2

void tsgUpdateGlobalGrid(void *grid,int depth,char *sType,int *anisotropic_weights,int *limit_levels
                        )

{
  TypeDepth type;
  ostream *poVar1;
  allocator<char> local_51;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,sType,&local_51);
  type = TasGrid::IO::getDepthTypeString(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (type == type_none) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"WARNING: incorrect depth type: ");
    poVar1 = std::operator<<(poVar1,sType);
    poVar1 = std::operator<<(poVar1,", defaulting to type_iptotal.");
    std::endl<char,std::char_traits<char>>(poVar1);
    type = type_iptotal;
  }
  TasGrid::TasmanianSparseGrid::updateGlobalGrid
            ((TasmanianSparseGrid *)grid,depth,type,anisotropic_weights,limit_levels);
  return;
}

Assistant:

void tsgUpdateGlobalGrid(void *grid, int depth, const char * sType, const int *anisotropic_weights, const int *limit_levels){
    TypeDepth depth_type = IO::getDepthTypeString(sType);
    #ifndef NDEBUG
    if (depth_type == type_none){ cerr << "WARNING: incorrect depth type: " << sType << ", defaulting to type_iptotal." << endl; }
    #endif // NDEBUG
    if (depth_type == type_none){ depth_type = type_iptotal; }
    ((TasmanianSparseGrid*) grid)->updateGlobalGrid(depth, depth_type, anisotropic_weights, limit_levels);
}